

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfsm-builder.cc
# Opt level: O0

Expression __thiscall
cnn::NonFactoredSoftmaxBuilder::neg_log_softmax
          (NonFactoredSoftmaxBuilder *this,Expression *rep,uint wordidx)

{
  initializer_list<cnn::expr::Expression> *in_RSI;
  ComputationGraph *in_RDI;
  Expression EVar1;
  ComputationGraph *this_00;
  uint in_stack_ffffffffffffffb4;
  Expression *in_stack_ffffffffffffffb8;
  
  this_00 = in_RDI;
  cnn::expr::Expression::Expression((Expression *)in_RDI,(Expression *)in_RSI);
  cnn::expr::Expression::Expression((Expression *)this_00,(Expression *)in_RSI);
  cnn::expr::Expression::Expression((Expression *)this_00,(Expression *)in_RSI);
  cnn::expr::affine_transform(in_RSI);
  EVar1 = cnn::expr::pickneglogsoftmax(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression NonFactoredSoftmaxBuilder::neg_log_softmax(const Expression& rep, unsigned wordidx) {
  return pickneglogsoftmax(affine_transform({b, w, rep}), wordidx);
}